

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

SinhLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::SinhLayerParams>(Arena *arena)

{
  SinhLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (SinhLayerParams *)operator_new(0x18);
    CoreML::Specification::SinhLayerParams::SinhLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (SinhLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,(type_info *)&CoreML::Specification::SinhLayerParams::typeinfo);
    CoreML::Specification::SinhLayerParams::SinhLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }